

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugFrame.cpp
# Opt level: O1

FrameEntry * __thiscall
llvm::DWARFDebugFrame::getEntryAtOffset(DWARFDebugFrame *this,uint64_t Offset)

{
  pointer puVar1;
  FrameEntry *pFVar2;
  ulong uVar3;
  pointer puVar4;
  FrameEntry *pFVar5;
  ulong uVar6;
  
  puVar4 = (this->Entries).
           super__Vector_base<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>,_std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->Entries).
           super__Vector_base<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>,_std::allocator<std::unique_ptr<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar6 = (long)puVar1 - (long)puVar4 >> 3;
  while (uVar3 = uVar6, 0 < (long)uVar3) {
    uVar6 = uVar3 >> 1;
    if ((puVar4[uVar6]._M_t.
         super___uniq_ptr_impl<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>
         ._M_t.
         super__Tuple_impl<0UL,_llvm::dwarf::FrameEntry_*,_std::default_delete<llvm::dwarf::FrameEntry>_>
         .super__Head_base<0UL,_llvm::dwarf::FrameEntry_*,_false>._M_head_impl)->Offset < Offset) {
      puVar4 = puVar4 + uVar6 + 1;
      uVar6 = ~uVar6 + uVar3;
    }
  }
  if (puVar4 == puVar1) {
    pFVar5 = (FrameEntry *)0x0;
  }
  else {
    pFVar2 = (puVar4->_M_t).
             super___uniq_ptr_impl<llvm::dwarf::FrameEntry,_std::default_delete<llvm::dwarf::FrameEntry>_>
             ._M_t.
             super__Tuple_impl<0UL,_llvm::dwarf::FrameEntry_*,_std::default_delete<llvm::dwarf::FrameEntry>_>
             .super__Head_base<0UL,_llvm::dwarf::FrameEntry_*,_false>._M_head_impl;
    pFVar5 = (FrameEntry *)0x0;
    if (pFVar2->Offset == Offset) {
      pFVar5 = pFVar2;
    }
  }
  return pFVar5;
}

Assistant:

FrameEntry *DWARFDebugFrame::getEntryAtOffset(uint64_t Offset) const {
  auto It = partition_point(Entries, [=](const std::unique_ptr<FrameEntry> &E) {
    return E->getOffset() < Offset;
  });
  if (It != Entries.end() && (*It)->getOffset() == Offset)
    return It->get();
  return nullptr;
}